

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O0

void refreshUI(void)

{
  int iVar1;
  int mode;
  
  iVar1 = Fl_Choice::value(wUserOrSystem);
  Fl_Choice::value(wVisibleFocus,opt[1][iVar1]);
  Fl_Choice::value(wArrowFocus,opt[0][iVar1]);
  Fl_Choice::value(wShowTooltips,opt[3][iVar1]);
  Fl_Choice::value(wDNDText,opt[2][iVar1]);
  Fl_Choice::value(wGTKText,opt[4][iVar1]);
  return;
}

Assistant:

static void refreshUI() {
  int mode = wUserOrSystem->value();
  wVisibleFocus->value(opt[Fl::OPTION_VISIBLE_FOCUS][mode]);
  wArrowFocus->value(opt[Fl::OPTION_ARROW_FOCUS][mode]);
  wShowTooltips->value(opt[Fl::OPTION_SHOW_TOOLTIPS][mode]);
  wDNDText->value(opt[Fl::OPTION_DND_TEXT][mode]);
  wGTKText->value(opt[Fl::OPTION_FNFC_USES_GTK][mode]);
}